

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

bool __thiscall
aiMetadata::Get<aiVector3t<float>>(aiMetadata *this,uint index,aiVector3t<float> *value)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  
  if (index < this->mNumProperties) {
    if (this->mValues[index].mType == AI_AIVECTOR3D) {
      puVar1 = (undefined8 *)this->mValues[index].mData;
      value->z = *(float *)(puVar1 + 1);
      uVar2 = *puVar1;
      value->x = (float)(int)uVar2;
      value->y = (float)(int)((ulong)uVar2 >> 0x20);
      return true;
    }
  }
  return false;
}

Assistant:

inline 
    bool Get( unsigned index, T& value ) const {
        // In range assertion
        if ( index >= mNumProperties ) {
            return false;
        }

        // Return false if the output data type does
        // not match the found value's data type
        if ( GetAiType( value ) != mValues[ index ].mType ) {
            return false;
        }

        // Otherwise, output the found value and
        // return true
        value = *static_cast<T*>(mValues[index].mData);

        return true;
    }